

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.cpp
# Opt level: O1

StatisticObject __thiscall Clasp::SolverStats::at(SolverStats *this,char *k)

{
  ExtendedStats *this_00;
  bool bVar1;
  int iVar2;
  uint32 type;
  uint64 in_RAX;
  StatisticObject SVar3;
  long lVar4;
  StatisticObject local_28;
  
  this_00 = this->extra;
  if (this_00 == (ExtendedStats *)0x0) goto LAB_0017444c;
  lVar4 = 5;
  local_28.handle_ = in_RAX;
  iVar2 = strncmp(k,"extra",5);
  if (iVar2 == 0) {
    if (k[5] != '\0') {
      if (k[5] != '.') goto LAB_00174411;
      lVar4 = 6;
    }
    k = k + lVar4;
    bVar1 = true;
  }
  else {
LAB_00174411:
    bVar1 = false;
  }
  if (bVar1) {
    if (*k != '\0') {
      SVar3 = ExtendedStats::at(this_00,k);
      return (StatisticObject)SVar3.handle_;
    }
    type = StatisticObject::registerMap<Clasp::ExtendedStats>();
    StatisticObject::StatisticObject(&local_28,this_00,type);
    return (StatisticObject)local_28.handle_;
  }
LAB_0017444c:
  SVar3 = CoreStats::at(&this->super_CoreStats,k);
  return (StatisticObject)SVar3.handle_;
}

Assistant:

StatisticObject SolverStats::at(const char* k) const {
	if (extra && matchPath(k, "extra")) {
		return !*k ? StatisticObject::map(extra) : extra->at(k);
	}
	else {
		return CoreStats::at(k);
	}
}